

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

array<char,_4UL> QLocalePrivate::languageToCode(Language language,LanguageCodeTypes codeTypes)

{
  array<char,_4UL> aVar1;
  const_reference this;
  uint uVar2;
  uint uVar3;
  _Type acVar4;
  
  uVar3 = 0;
  if ((ushort)(language + ~LastLanguage) < 0xfea6) {
    uVar2 = 0;
    uVar3 = 0;
  }
  else if (language == C) {
    uVar2 = 0x43;
  }
  else {
    this = std::array<LanguageCodeEntry,_347UL>::operator[](&languageCodeList,(ulong)language);
    if ((((uint)codeTypes.super_QFlagsStorageHelper<QLocale::LanguageCodeType,_4>.
                super_QFlagsStorage<QLocale::LanguageCodeType>.i & 1) == 0) ||
       (((ushort)this->part1 & 0x1f) == 0)) {
      if ((((uint)codeTypes.super_QFlagsStorageHelper<QLocale::LanguageCodeType,_4>.
                  super_QFlagsStorage<QLocale::LanguageCodeType>.i & 2) == 0) ||
         (((ushort)this->part2B & 0x1f) == 0)) {
        if ((((uint)codeTypes.super_QFlagsStorageHelper<QLocale::LanguageCodeType,_4>.
                    super_QFlagsStorage<QLocale::LanguageCodeType>.i & 4) == 0) ||
           (((ushort)this->part2T & 0x1f) == 0)) {
          uVar2 = 0;
          if (((uint)codeTypes.super_QFlagsStorageHelper<QLocale::LanguageCodeType,_4>.
                     super_QFlagsStorage<QLocale::LanguageCodeType>.i & 8) == 0) goto LAB_002d76b0;
          this = (const_reference)&this->part3;
        }
        else {
          this = (const_reference)&this->part2T;
        }
      }
      else {
        this = (const_reference)&this->part2B;
      }
    }
    aVar1 = AlphaCode::decode(&this->part1);
    uVar2 = (uint)aVar1._M_elems & 0xff;
    uVar3 = (uint)aVar1._M_elems & 0xffffff00;
  }
LAB_002d76b0:
  acVar4 = (_Type)(uVar3 | uVar2);
  aVar1._M_elems[0] = acVar4[0];
  aVar1._M_elems[1] = acVar4[1];
  aVar1._M_elems[2] = acVar4[2];
  aVar1._M_elems[3] = acVar4[3];
  return (array<char,_4UL>)aVar1._M_elems;
}

Assistant:

std::array<char, 4> QLocalePrivate::languageToCode(QLocale::Language language,
                                                   QLocale::LanguageCodeTypes codeTypes)
{
    if (language == QLocale::AnyLanguage || language > QLocale::LastLanguage)
        return {};
    if (language == QLocale::C)
        return {'C'};

    const LanguageCodeEntry &i = languageCodeList[language];

    if (codeTypes.testFlag(QLocale::ISO639Part1) && i.part1.isValid())
        return i.part1.decode();

    if (codeTypes.testFlag(QLocale::ISO639Part2B) && i.part2B.isValid())
        return i.part2B.decode();

    if (codeTypes.testFlag(QLocale::ISO639Part2T) && i.part2T.isValid())
        return i.part2T.decode();

    if (codeTypes.testFlag(QLocale::ISO639Part3))
        return i.part3.decode();

    return {};
}